

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall chrono::curiosity::Curiosity::Initialize(Curiosity *this,ChFrame<double> *pos)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  double dVar1;
  ChSystem *pCVar2;
  bool bVar3;
  int iVar4;
  element_type *this_01;
  element_type *peVar5;
  __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var6;
  element_type *peVar7;
  __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var8;
  element_type *peVar9;
  __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var10;
  element_type *peVar11;
  __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var12;
  element_type *peVar13;
  __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var14;
  element_type *peVar15;
  element_type *peVar16;
  reference pvVar17;
  reference pvVar18;
  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var19;
  element_type *peVar20;
  __shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  reference pvVar21;
  element_type *peVar22;
  reference pvVar23;
  long lVar24;
  reference pvVar25;
  double *pdVar26;
  reference pvVar27;
  shared_ptr<chrono::ChBodyAuxRef> sVar28;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_7e8;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_7b8;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_7a8;
  undefined1 local_798 [16];
  undefined1 local_788 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_778;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_768;
  undefined1 local_758 [16];
  undefined1 local_748 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_738;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_728;
  undefined1 local_718 [16];
  undefined1 local_708 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_6f8;
  ChVector<double> local_6e8;
  ChVector<double> local_6d0;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_6b8;
  undefined1 local_6a8 [16];
  undefined1 local_698 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_688;
  ChVector<double> local_678;
  ChVector<double> local_660;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_648;
  undefined1 local_638 [16];
  undefined1 local_628 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_618;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_608;
  undefined1 local_5f8 [16];
  undefined1 local_5e8 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_5d8;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_5c8;
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_598;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_588;
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_558;
  shared_ptr<chrono::ChFunction> local_548;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_538;
  undefined1 local_528 [32];
  undefined1 local_508 [32];
  shared_ptr<chrono::ChLinkMotorRotationAngle> local_4e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4d8;
  shared_ptr<chrono::ChFunction_Const> local_4d0;
  int local_4bc;
  undefined1 local_4b8 [4];
  int i_7;
  ChVector<double> bogie_motor_loc [2];
  ChQuaternion<double> local_478;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_458;
  undefined1 local_448 [32];
  undefined1 local_428 [32];
  shared_ptr<chrono::ChLinkMotorRotationAngle> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  shared_ptr<chrono::ChFunction_Const> local_3f0;
  int local_3dc;
  undefined1 local_3d8 [4];
  int i_6;
  ChVector<double> rocker_motor_loc [2];
  shared_ptr<chrono::ChPhysicsItem> local_3a0;
  ChVector<double> local_390;
  undefined1 local_378 [32];
  shared_ptr<chrono::ChShaft> local_358;
  undefined1 local_348 [8];
  shared_ptr<chrono::ChShaftsBody> shaftbody_connection;
  int local_324;
  int i_5;
  double J;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_2e8;
  shared_ptr<chrono::ChFunction> local_2d8;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_2c8;
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  shared_ptr<chrono::ChLinkMotorRotationSpeed> local_278;
  shared_ptr<chrono::ChFunction_Setpoint> local_268;
  int local_254;
  undefined1 local_250 [4];
  int i_4;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_220;
  shared_ptr<chrono::ChFunction> local_210;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_200;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [32];
  shared_ptr<chrono::ChLinkMotorRotationSpeed> local_1b0;
  shared_ptr<chrono::ChFunction_Setpoint> local_1a0;
  int local_18c;
  undefined1 local_188 [4];
  int i_3;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  shared_ptr<chrono::ChLinkLockRevolute> local_158;
  shared_ptr<chrono::ChFunction> local_148;
  shared_ptr<chrono::curiosity::CuriosityChassis> local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  shared_ptr<chrono::ChLinkMotorRotationSpeed> local_e8;
  shared_ptr<chrono::ChFunction_Setpoint> local_d8;
  int local_c4;
  undefined1 local_c0 [4];
  int i_2;
  ChQuaternion<double> z2y;
  int local_8c;
  undefined1 local_88 [4];
  int i_1;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  float local_38;
  int i;
  undefined1 local_28 [24];
  ChFrame<double> *pos_local;
  Curiosity *this_local;
  
  local_28._16_8_ = pos;
  pos_local = (ChFrame<double> *)this;
  bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_driver);
  if (bVar3) {
    this_01 = std::
              __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_chassis);
    CuriosityChassis::Initialize(this_01,this->m_system,(ChFrame<double> *)local_28._16_8_);
    peVar5 = std::
             __shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_diff_bar);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_28);
    (*(peVar5->super_CuriosityPart)._vptr_CuriosityPart[2])
              (peVar5,(CuriosityPart *)local_28,
               sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._M_pi);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr((shared_ptr<chrono::ChBodyAuxRef> *)local_28)
    ;
    for (local_38 = 0.0; (int)local_38 < 2; local_38 = (float)((int)local_38 + 1)) {
      p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                            (&this->m_rockers,(long)(int)local_38);
      peVar7 = std::
               __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var6);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_48);
      (*(peVar7->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar7,(CuriosityPart *)local_48,
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_48);
      p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                            (&this->m_bogies,(long)(int)local_38);
      peVar9 = std::
               __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var8);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_58);
      (*(peVar9->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar9,(CuriosityPart *)local_58,
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_58);
      p_Var10 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                   operator[](&this->m_diff_links,(long)(int)local_38);
      peVar11 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var10);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_68);
      (*(peVar11->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar11,(CuriosityPart *)local_68,
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_68);
      p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                             (&this->m_rocker_uprights,(long)(int)local_38);
      peVar13 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var12);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_78);
      (*(peVar13->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar13,(CuriosityPart *)local_78,
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_78);
      p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                             (&this->m_bogie_uprights,(long)(int)local_38);
      peVar13 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var12);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)local_88);
      (*(peVar13->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar13,(CuriosityPart *)local_88,
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_88);
    }
    for (local_8c = 0; local_8c < 6; local_8c = local_8c + 1) {
      p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                             (&this->m_wheels,(long)local_8c);
      peVar15 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var14);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&this->m_chassis);
      sVar28 = CuriosityPart::GetBody((CuriosityPart *)(z2y.m_data + 3));
      (*(peVar15->super_CuriosityPart)._vptr_CuriosityPart[2])
                (peVar15,(CuriosityPart *)(z2y.m_data + 3),
                 sVar28.super___shared_ptr<chrono::ChBodyAuxRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)(z2y.m_data + 3));
    }
    chrono::Q_from_AngX(1.5707963267948966);
    for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
      peVar16 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_driver);
      iVar4 = (*peVar16->_vptr_CuriosityDriver[2])();
      if (iVar4 == 0) {
        chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_c4);
        std::shared_ptr<chrono::ChFunction_Setpoint>::operator=(pvVar17,&local_d8);
        std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr(&local_d8);
        p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::
                     operator[](&this->m_rocker_uprights,(long)local_c4);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var12);
        CuriosityPart::GetBody((CuriosityPart *)local_108);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_108 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_108);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_c4);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_128);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_128 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_128);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  (&local_138,&this->m_chassis);
        AddMotorSpeed((curiosity *)&local_e8,(shared_ptr<chrono::ChBody> *)(local_108 + 0x10),
                      (shared_ptr<chrono::ChBody> *)(local_128 + 0x10),&local_138,
                      (ChVector<double> *)(wheel_pos + (long)local_c4 * 0x18),
                      (ChQuaternion<double> *)local_c0);
        pvVar18 = std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                            (&this->m_drive_motors,(long)local_c4);
        std::shared_ptr<chrono::ChLinkMotorRotation>::operator=(pvVar18,&local_e8);
        std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr(&local_e8);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_138);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_128 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_128);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_108 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_108);
        p_Var19 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                               (&this->m_drive_motors,(long)local_c4);
        peVar20 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var19);
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_c4);
        std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                  (&local_148,pvVar17);
        ChLinkMotor::SetMotorFunction((ChLinkMotor *)peVar20,&local_148);
        std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_148);
      }
      else if (iVar4 == 1) {
        p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::
                     operator[](&this->m_rocker_uprights,(long)local_c4);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var12);
        CuriosityPart::GetBody((CuriosityPart *)local_168);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_c4);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_178);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)local_188,&this->m_chassis);
        AddRevoluteJoint((curiosity *)&local_158,(shared_ptr<chrono::ChBodyAuxRef> *)local_168,
                         (shared_ptr<chrono::ChBodyAuxRef> *)local_178,
                         (shared_ptr<chrono::curiosity::CuriosityChassis> *)local_188,
                         (ChVector<double> *)(wheel_pos + (long)local_c4 * 0x18),
                         (ChQuaternion<double> *)local_c0);
        std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_158);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)local_188);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_178);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_168);
      }
    }
    for (local_18c = 2; local_18c < 4; local_18c = local_18c + 1) {
      peVar16 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_driver);
      iVar4 = (*peVar16->_vptr_CuriosityDriver[2])();
      if (iVar4 == 0) {
        chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_18c);
        std::shared_ptr<chrono::ChFunction_Setpoint>::operator=(pvVar17,&local_1a0);
        std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr(&local_1a0);
        p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                              (&this->m_bogies,(long)(local_18c + -2));
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var8);
        CuriosityPart::GetBody((CuriosityPart *)local_1d0);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_1d0 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_1d0);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_18c);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_1f0);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_1f0 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_1f0);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  (&local_200,&this->m_chassis);
        AddMotorSpeed((curiosity *)&local_1b0,(shared_ptr<chrono::ChBody> *)(local_1d0 + 0x10),
                      (shared_ptr<chrono::ChBody> *)(local_1f0 + 0x10),&local_200,
                      (ChVector<double> *)(wheel_pos + (long)local_18c * 0x18),
                      (ChQuaternion<double> *)local_c0);
        pvVar18 = std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                            (&this->m_drive_motors,(long)local_18c);
        std::shared_ptr<chrono::ChLinkMotorRotation>::operator=(pvVar18,&local_1b0);
        std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr(&local_1b0);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_200);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_1f0 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_1f0);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_1d0 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_1d0);
        p_Var19 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                               (&this->m_drive_motors,(long)local_18c);
        peVar20 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var19);
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_18c);
        std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                  (&local_210,pvVar17);
        ChLinkMotor::SetMotorFunction((ChLinkMotor *)peVar20,&local_210);
        std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_210);
      }
      else if (iVar4 == 1) {
        p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                              (&this->m_bogies,(long)(local_18c + -2));
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var8);
        CuriosityPart::GetBody((CuriosityPart *)local_230);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_18c);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_240);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)local_250,&this->m_chassis);
        AddRevoluteJoint((curiosity *)&local_220,(shared_ptr<chrono::ChBodyAuxRef> *)local_230,
                         (shared_ptr<chrono::ChBodyAuxRef> *)local_240,
                         (shared_ptr<chrono::curiosity::CuriosityChassis> *)local_250,
                         (ChVector<double> *)(wheel_pos + (long)local_18c * 0x18),
                         (ChQuaternion<double> *)local_c0);
        std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_220);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)local_250);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_240);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_230);
      }
    }
    for (local_254 = 4; local_254 < 6; local_254 = local_254 + 1) {
      peVar16 = std::
                __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_driver);
      iVar4 = (*peVar16->_vptr_CuriosityDriver[2])();
      if (iVar4 == 0) {
        chrono_types::make_shared<chrono::ChFunction_Setpoint,_0>();
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_254);
        std::shared_ptr<chrono::ChFunction_Setpoint>::operator=(pvVar17,&local_268);
        std::shared_ptr<chrono::ChFunction_Setpoint>::~shared_ptr(&local_268);
        p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::
                     operator[](&this->m_bogie_uprights,(long)(local_254 + -4));
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var12);
        CuriosityPart::GetBody((CuriosityPart *)local_298);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_298 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_298);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_254);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_2b8);
        std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                  ((shared_ptr<chrono::ChBody> *)(local_2b8 + 0x10),
                   (shared_ptr<chrono::ChBodyAuxRef> *)local_2b8);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  (&local_2c8,&this->m_chassis);
        AddMotorSpeed((curiosity *)&local_278,(shared_ptr<chrono::ChBody> *)(local_298 + 0x10),
                      (shared_ptr<chrono::ChBody> *)(local_2b8 + 0x10),&local_2c8,
                      (ChVector<double> *)(wheel_pos + (long)local_254 * 0x18),
                      (ChQuaternion<double> *)local_c0);
        pvVar18 = std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                            (&this->m_drive_motors,(long)local_254);
        std::shared_ptr<chrono::ChLinkMotorRotation>::operator=(pvVar18,&local_278);
        std::shared_ptr<chrono::ChLinkMotorRotationSpeed>::~shared_ptr(&local_278);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_2c8);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_2b8 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_2b8);
        std::shared_ptr<chrono::ChBody>::~shared_ptr
                  ((shared_ptr<chrono::ChBody> *)(local_298 + 0x10));
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_298);
        p_Var19 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_6UL>::operator[]
                               (&this->m_drive_motors,(long)local_254);
        peVar20 = std::
                  __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->(p_Var19);
        pvVar17 = std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                            (&this->m_drive_motor_funcs,(long)local_254);
        std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Setpoint,void>
                  (&local_2d8,pvVar17);
        ChLinkMotor::SetMotorFunction((ChLinkMotor *)peVar20,&local_2d8);
        std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_2d8);
      }
      else if (iVar4 == 1) {
        p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::
                     operator[](&this->m_bogie_uprights,(long)(local_254 + -4));
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var12);
        CuriosityPart::GetBody((CuriosityPart *)local_2f8);
        p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                               (&this->m_wheels,(long)local_254);
        std::
        __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->(p_Var14);
        CuriosityPart::GetBody((CuriosityPart *)local_308);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)&J,&this->m_chassis);
        AddRevoluteJoint((curiosity *)&local_2e8,(shared_ptr<chrono::ChBodyAuxRef> *)local_2f8,
                         (shared_ptr<chrono::ChBodyAuxRef> *)local_308,
                         (shared_ptr<chrono::curiosity::CuriosityChassis> *)&J,
                         (ChVector<double> *)(wheel_pos + (long)local_254 * 0x18),
                         (ChQuaternion<double> *)local_c0);
        std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_2e8);
        std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr
                  ((shared_ptr<chrono::curiosity::CuriosityChassis> *)&J);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_308);
        std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                  ((shared_ptr<chrono::ChBodyAuxRef> *)local_2f8);
      }
    }
    for (local_324 = 0; local_324 < 6; local_324 = local_324 + 1) {
      this_02 = (__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                          (&this->m_drive_shafts,(long)local_324);
      std::__shared_ptr_access<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(this_02);
      chrono::ChShaft::SetInertia(0.1);
      pCVar2 = this->m_system;
      pvVar21 = std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                          (&this->m_drive_shafts,(long)local_324);
      this_00 = &shaftbody_connection.
                 super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChShaft,void>
                ((shared_ptr<chrono::ChPhysicsItem> *)this_00,pvVar21);
      chrono::ChSystem::Add(pCVar2,this_00);
      std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr
                ((shared_ptr<chrono::ChPhysicsItem> *)
                 &shaftbody_connection.
                  super___shared_ptr<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      chrono_types::make_shared<chrono::ChShaftsBody,_0>();
      peVar22 = std::
                __shared_ptr_access<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<chrono::ChShaftsBody,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_348);
      pvVar21 = std::array<std::shared_ptr<chrono::ChShaft>,_6UL>::operator[]
                          (&this->m_drive_shafts,(long)local_324);
      std::shared_ptr<chrono::ChShaft>::shared_ptr(&local_358,pvVar21);
      p_Var14 = (__shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityWheel>,_6UL>::operator[]
                             (&this->m_wheels,(long)local_324);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityWheel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(p_Var14);
      CuriosityPart::GetBody((CuriosityPart *)local_378);
      std::shared_ptr<chrono::ChBodyFrame>::shared_ptr<chrono::ChBodyAuxRef,void>
                ((shared_ptr<chrono::ChBodyFrame> *)(local_378 + 0x10),
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_378);
      ChVector<double>::ChVector(&local_390,0.0,-1.0,0.0);
      chrono::ChShaftsBody::Initialize(peVar22,&local_358,local_378 + 0x10,&local_390);
      std::shared_ptr<chrono::ChBodyFrame>::~shared_ptr
                ((shared_ptr<chrono::ChBodyFrame> *)(local_378 + 0x10));
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_378);
      std::shared_ptr<chrono::ChShaft>::~shared_ptr(&local_358);
      pCVar2 = this->m_system;
      std::shared_ptr<chrono::ChPhysicsItem>::shared_ptr<chrono::ChShaftsBody,void>
                (&local_3a0,(shared_ptr<chrono::ChShaftsBody> *)local_348);
      chrono::ChSystem::Add(pCVar2,&local_3a0);
      std::shared_ptr<chrono::ChPhysicsItem>::~shared_ptr(&local_3a0);
      std::shared_ptr<chrono::ChShaftsBody>::~shared_ptr
                ((shared_ptr<chrono::ChShaftsBody> *)local_348);
    }
    ChVector<double>::ChVector((ChVector<double> *)local_3d8,(ChVector<double> *)sr_rel_pos_lf);
    ChVector<double>::ChVector
              ((ChVector<double> *)(rocker_motor_loc[0].m_data + 2),
               (ChVector<double> *)sr_rel_pos_rf);
    for (local_3dc = 0; local_3dc < 2; local_3dc = local_3dc + 1) {
      local_3f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      chrono_types::make_shared<chrono::ChFunction_Const,_double,_0>((double *)&local_3f0);
      pvVar23 = std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_rocker_motor_funcs,(long)local_3dc);
      std::shared_ptr<chrono::ChFunction_Const>::operator=(pvVar23,&local_3f0);
      std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr(&local_3f0);
      p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                             (&this->m_rocker_uprights,(long)local_3dc);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(p_Var12);
      CuriosityPart::GetBody((CuriosityPart *)local_428);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                ((shared_ptr<chrono::ChBody> *)(local_428 + 0x10),
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_428);
      p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                            (&this->m_rockers,(long)local_3dc);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(p_Var6);
      CuriosityPart::GetBody((CuriosityPart *)local_448);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                ((shared_ptr<chrono::ChBody> *)(local_448 + 0x10),
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_448);
      std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_458,&this->m_chassis);
      lVar24 = (long)local_3dc;
      chrono::Q_from_AngX(3.141592653589793);
      AddMotorAngle((curiosity *)&local_408,(shared_ptr<chrono::ChBody> *)(local_428 + 0x10),
                    (shared_ptr<chrono::ChBody> *)(local_448 + 0x10),&local_458,
                    (ChVector<double> *)(local_3d8 + lVar24 * 0x18),&local_478);
      pvVar25 = std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::operator[]
                          (&this->m_rocker_motors,(long)local_3dc);
      std::shared_ptr<chrono::ChLinkMotorRotation>::operator=(pvVar25,&local_408);
      std::shared_ptr<chrono::ChLinkMotorRotationAngle>::~shared_ptr(&local_408);
      std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_458);
      std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_448 + 0x10))
      ;
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_448);
      std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_428 + 0x10))
      ;
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_428);
      p_Var19 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::operator[]
                             (&this->m_rocker_motors,(long)local_3dc);
      peVar20 = std::
                __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var19);
      pvVar23 = std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_rocker_motor_funcs,(long)local_3dc);
      std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
                ((shared_ptr<chrono::ChFunction> *)(bogie_motor_loc[1].m_data + 2),pvVar23);
      ChLinkMotor::SetMotorFunction
                ((ChLinkMotor *)peVar20,
                 (shared_ptr<chrono::ChFunction> *)(bogie_motor_loc[1].m_data + 2));
      std::shared_ptr<chrono::ChFunction>::~shared_ptr
                ((shared_ptr<chrono::ChFunction> *)(bogie_motor_loc[1].m_data + 2));
    }
    ChVector<double>::ChVector((ChVector<double> *)local_4b8,(ChVector<double> *)sr_rel_pos_lb);
    ChVector<double>::ChVector
              ((ChVector<double> *)(bogie_motor_loc[0].m_data + 2),(ChVector<double> *)sr_rel_pos_rb
              );
    for (local_4bc = 0; local_4bc < 2; local_4bc = local_4bc + 1) {
      local_4d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      chrono_types::make_shared<chrono::ChFunction_Const,_double,_0>((double *)&local_4d0);
      pvVar23 = std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_bogie_motor_funcs,(long)local_4bc);
      std::shared_ptr<chrono::ChFunction_Const>::operator=(pvVar23,&local_4d0);
      std::shared_ptr<chrono::ChFunction_Const>::~shared_ptr(&local_4d0);
      p_Var12 = (__shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::curiosity::CuriosityUpright>,_2UL>::operator[]
                             (&this->m_bogie_uprights,(long)local_4bc);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityUpright,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(p_Var12);
      CuriosityPart::GetBody((CuriosityPart *)local_508);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                ((shared_ptr<chrono::ChBody> *)(local_508 + 0x10),
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_508);
      p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                            (&this->m_bogies,(long)local_4bc);
      std::
      __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->(p_Var8);
      CuriosityPart::GetBody((CuriosityPart *)local_528);
      std::shared_ptr<chrono::ChBody>::shared_ptr<chrono::ChBodyAuxRef,void>
                ((shared_ptr<chrono::ChBody> *)(local_528 + 0x10),
                 (shared_ptr<chrono::ChBodyAuxRef> *)local_528);
      std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_538,&this->m_chassis);
      AddMotorAngle((curiosity *)&local_4e8,(shared_ptr<chrono::ChBody> *)(local_508 + 0x10),
                    (shared_ptr<chrono::ChBody> *)(local_528 + 0x10),&local_538,
                    (ChVector<double> *)(local_4b8 + (long)local_4bc * 0x18),
                    (ChQuaternion<double> *)&QUNIT);
      pvVar25 = std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::operator[]
                          (&this->m_bogie_motors,(long)local_4bc);
      std::shared_ptr<chrono::ChLinkMotorRotation>::operator=(pvVar25,&local_4e8);
      std::shared_ptr<chrono::ChLinkMotorRotationAngle>::~shared_ptr(&local_4e8);
      std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_538);
      std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_528 + 0x10))
      ;
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_528);
      std::shared_ptr<chrono::ChBody>::~shared_ptr((shared_ptr<chrono::ChBody> *)(local_508 + 0x10))
      ;
      std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
                ((shared_ptr<chrono::ChBodyAuxRef> *)local_508);
      p_Var19 = (__shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::ChLinkMotorRotation>,_2UL>::operator[]
                             (&this->m_bogie_motors,(long)local_4bc);
      peVar20 = std::
                __shared_ptr_access<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->(p_Var19);
      pvVar23 = std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_bogie_motor_funcs,(long)local_4bc);
      std::shared_ptr<chrono::ChFunction>::shared_ptr<chrono::ChFunction_Const,void>
                (&local_548,pvVar23);
      ChLinkMotor::SetMotorFunction((ChLinkMotor *)peVar20,&local_548);
      std::shared_ptr<chrono::ChFunction>::~shared_ptr(&local_548);
    }
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_diff_bar);
    CuriosityPart::GetBody((CuriosityPart *)local_568);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    CuriosityPart::GetBody((CuriosityPart *)local_578);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_588,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_558,(shared_ptr<chrono::ChBodyAuxRef> *)local_568,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_578,&local_588,
                     (ChVector<double> *)tr_rel_pos_t,(ChQuaternion<double> *)&QUNIT);
    std::shared_ptr<chrono::ChLinkLockRevolute>::operator=(&this->m_diff_joint,&local_558);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_558);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_588);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_578);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_568);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_5a8);
    p_Var10 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                 operator[](&this->m_diff_links,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var10);
    CuriosityPart::GetBody((CuriosityPart *)local_5b8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_5c8,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_598,(shared_ptr<chrono::ChBodyAuxRef> *)local_5a8,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_5b8,&local_5c8,
                     (ChVector<double> *)tr_rel_pos_l,(ChQuaternion<double> *)local_c0);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_598);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_5c8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_5b8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_5a8);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_5e8);
    p_Var10 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                 operator[](&this->m_diff_links,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var10);
    CuriosityPart::GetBody((CuriosityPart *)local_5f8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_608,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_5d8,(shared_ptr<chrono::ChBodyAuxRef> *)local_5e8,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_5f8,&local_608,
                     (ChVector<double> *)tr_rel_pos_r,(ChQuaternion<double> *)local_c0);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_5d8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_608);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_5f8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_5e8);
    p_Var10 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                 operator[](&this->m_diff_links,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var10);
    CuriosityPart::GetBody((CuriosityPart *)local_628);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_diff_bar);
    CuriosityPart::GetBody((CuriosityPart *)local_638);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_648,&this->m_chassis);
    pdVar26 = ChVector<double>::x((ChVector<double> *)tr_rel_pos_t);
    dVar1 = *pdVar26;
    pdVar26 = ChVector<double>::x((ChVector<double> *)tr_rel_pos_l);
    ChVector<double>::ChVector(&local_678,dVar1 - *pdVar26,0.0,0.0);
    ChVector<double>::operator+(&local_660,(ChVector<double> *)tr_rel_pos_l,&local_678);
    AddRevoluteJoint((curiosity *)&local_618,(shared_ptr<chrono::ChBodyAuxRef> *)local_628,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_638,&local_648,&local_660,
                     (ChQuaternion<double> *)&QUNIT);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_618);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_648);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_638);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_628);
    p_Var10 = (__shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::array<std::shared_ptr<chrono::curiosity::CuriosityDifferentialLink>,_3UL>::
                 operator[](&this->m_diff_links,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var10);
    CuriosityPart::GetBody((CuriosityPart *)local_698);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDifferentialBar,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_diff_bar);
    CuriosityPart::GetBody((CuriosityPart *)local_6a8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_6b8,&this->m_chassis);
    pdVar26 = ChVector<double>::x((ChVector<double> *)tr_rel_pos_t);
    dVar1 = *pdVar26;
    pdVar26 = ChVector<double>::x((ChVector<double> *)tr_rel_pos_r);
    ChVector<double>::ChVector(&local_6e8,dVar1 - *pdVar26,0.0,0.0);
    ChVector<double>::operator+(&local_6d0,(ChVector<double> *)tr_rel_pos_r,&local_6e8);
    AddRevoluteJoint((curiosity *)&local_688,(shared_ptr<chrono::ChBodyAuxRef> *)local_698,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_6a8,&local_6b8,&local_6d0,
                     (ChQuaternion<double> *)&QUNIT);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_688);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_6b8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_6a8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_698);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_708);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    CuriosityPart::GetBody((CuriosityPart *)local_718);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_728,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_6f8,(shared_ptr<chrono::ChBodyAuxRef> *)local_708,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_718,&local_728,
                     (ChVector<double> *)cr_rel_pos_lf,(ChQuaternion<double> *)local_c0);
    pvVar27 = std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::operator[]
                        (&this->m_rocker_joints,0);
    std::shared_ptr<chrono::ChLinkLockRevolute>::operator=(pvVar27,&local_6f8);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_6f8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_728);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_718);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_708);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_748);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityChassis,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&this->m_chassis);
    CuriosityPart::GetBody((CuriosityPart *)local_758);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_768,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_738,(shared_ptr<chrono::ChBodyAuxRef> *)local_748,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_758,&local_768,
                     (ChVector<double> *)cr_rel_pos_rf,(ChQuaternion<double> *)local_c0);
    pvVar27 = std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::operator[]
                        (&this->m_rocker_joints,1);
    std::shared_ptr<chrono::ChLinkLockRevolute>::operator=(pvVar27,&local_738);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_738);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_768);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_758);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_748);
    p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                          (&this->m_bogies,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var8);
    CuriosityPart::GetBody((CuriosityPart *)local_788);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,0);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_798);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_7a8,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_778,(shared_ptr<chrono::ChBodyAuxRef> *)local_788,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_798,&local_7a8,
                     (ChVector<double> *)cr_rel_pos_lb,(ChQuaternion<double> *)local_c0);
    pvVar27 = std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::operator[]
                        (&this->m_bogie_joints,0);
    std::shared_ptr<chrono::ChLinkLockRevolute>::operator=(pvVar27,&local_778);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_778);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_7a8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_798);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_788);
    p_Var8 = (__shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityBogie>,_2UL>::operator[]
                          (&this->m_bogies,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityBogie,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var8);
    CuriosityPart::GetBody((CuriosityPart *)local_7c8);
    p_Var6 = (__shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::curiosity::CuriosityRocker>,_2UL>::operator[]
                          (&this->m_rockers,1);
    std::
    __shared_ptr_access<chrono::curiosity::CuriosityRocker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var6);
    CuriosityPart::GetBody((CuriosityPart *)local_7d8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::shared_ptr(&local_7e8,&this->m_chassis);
    AddRevoluteJoint((curiosity *)&local_7b8,(shared_ptr<chrono::ChBodyAuxRef> *)local_7c8,
                     (shared_ptr<chrono::ChBodyAuxRef> *)local_7d8,&local_7e8,
                     (ChVector<double> *)cr_rel_pos_rb,(ChQuaternion<double> *)local_c0);
    pvVar27 = std::array<std::shared_ptr<chrono::ChLinkLockRevolute>,_2UL>::operator[]
                        (&this->m_bogie_joints,1);
    std::shared_ptr<chrono::ChLinkLockRevolute>::operator=(pvVar27,&local_7b8);
    std::shared_ptr<chrono::ChLinkLockRevolute>::~shared_ptr(&local_7b8);
    std::shared_ptr<chrono::curiosity::CuriosityChassis>::~shared_ptr(&local_7e8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7d8);
    std::shared_ptr<chrono::ChBodyAuxRef>::~shared_ptr
              ((shared_ptr<chrono::ChBodyAuxRef> *)local_7c8);
    this->m_initialized = true;
    return;
  }
  __assert_fail("m_driver",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_models/robot/curiosity/Curiosity.cpp"
                ,0x1c8,"void chrono::curiosity::Curiosity::Initialize(const ChFrame<> &)");
}

Assistant:

void Curiosity::Initialize(const ChFrame<>& pos) {
    assert(m_driver);

    // Initialize rover parts, fixing bodies to ground as requested
    m_chassis->Initialize(m_system, pos);
    m_diff_bar->Initialize(m_chassis->GetBody());

    for (int i = 0; i < 2; i++) {
        m_rockers[i]->Initialize(m_chassis->GetBody());
        m_bogies[i]->Initialize(m_chassis->GetBody());

        m_diff_links[i]->Initialize(m_chassis->GetBody());

        m_rocker_uprights[i]->Initialize(m_chassis->GetBody());
        m_bogie_uprights[i]->Initialize(m_chassis->GetBody());
    }
    for (int i = 0; i < 6; i++) {
        m_wheels[i]->Initialize(m_chassis->GetBody());
    }

    // Add drive motors on all six wheels
    ChQuaternion<> z2y = Q_from_AngX(CH_C_PI_2);  // align Z with (negative) Y

    // Front (wheels attached to rocker uprights)
    for (int i = 0; i < 2; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] = AddMotorSpeed(m_rocker_uprights[i]->GetBody(), m_wheels[i]->GetBody(), m_chassis,
                                                  wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_rocker_uprights[i]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                break;
        }
    }

    // Middle (wheeled attached to bogies)
    for (int i = 2; i < 4; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] =
                    AddMotorSpeed(m_bogies[i - 2]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_bogies[i - 2]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i], z2y);
                break;
        }
    }

    // Rear (wheels attached to bogie uprights)
    for (int i = 4; i < 6; i++) {
        switch (m_driver->GetDriveMotorType()) {
            case CuriosityDriver::DriveMotorType::SPEED:
                m_drive_motor_funcs[i] = chrono_types::make_shared<ChFunction_Setpoint>();
                m_drive_motors[i] = AddMotorSpeed(m_bogie_uprights[i - 4]->GetBody(), m_wheels[i]->GetBody(), m_chassis,
                                                  wheel_pos[i], z2y);
                m_drive_motors[i]->SetMotorFunction(m_drive_motor_funcs[i]);
                break;
            case CuriosityDriver::DriveMotorType::TORQUE:
                AddRevoluteJoint(m_bogie_uprights[i - 4]->GetBody(), m_wheels[i]->GetBody(), m_chassis, wheel_pos[i],
                                 z2y);
                break;
        }
    }

    double J = 0.1;  // shaft rotational inertia
    for (int i = 0; i < 6; i++) {
        m_drive_shafts[i]->SetInertia(J);
        m_system->Add(m_drive_shafts[i]);

        // Connect shaft aligned with the wheel's axis of rotation (local wheel Y).
        // Set connection such that a positive torque applied to the shaft results in forward rover motion.
        auto shaftbody_connection = chrono_types::make_shared<ChShaftsBody>();
        shaftbody_connection->Initialize(m_drive_shafts[i], m_wheels[i]->GetBody(), ChVector<>(0, -1, 0));
        m_system->Add(shaftbody_connection);
    }

    // Add steering motors
    ChVector<> rocker_motor_loc[] = {sr_rel_pos_lf, sr_rel_pos_rf};
    for (int i = 0; i < 2; i++) {
        m_rocker_motor_funcs[i] = chrono_types::make_shared<ChFunction_Const>(0.0);
        m_rocker_motors[i] = AddMotorAngle(m_rocker_uprights[i]->GetBody(), m_rockers[i]->GetBody(), m_chassis,
                                           rocker_motor_loc[i], Q_from_AngX(CH_C_PI));
        m_rocker_motors[i]->SetMotorFunction(m_rocker_motor_funcs[i]);
    }

    ChVector<> bogie_motor_loc[] = {sr_rel_pos_lb, sr_rel_pos_rb};
    for (int i = 0; i < 2; i++) {
        m_bogie_motor_funcs[i] = chrono_types::make_shared<ChFunction_Const>(0.0);
        m_bogie_motors[i] =
            AddMotorAngle(m_bogie_uprights[i]->GetBody(), m_bogies[i]->GetBody(), m_chassis, bogie_motor_loc[i], QUNIT);
        m_bogie_motors[i]->SetMotorFunction(m_bogie_motor_funcs[i]);
    }

    // Connect the differential bar to chassis
    m_diff_joint = AddRevoluteJoint(m_diff_bar->GetBody(), m_chassis->GetBody(), m_chassis, tr_rel_pos_t, QUNIT);

    // Connect differential links to differential bar and to the rockers
    AddRevoluteJoint(m_rockers[0]->GetBody(), m_diff_links[0]->GetBody(), m_chassis, tr_rel_pos_l, z2y);
    AddRevoluteJoint(m_rockers[1]->GetBody(), m_diff_links[1]->GetBody(), m_chassis, tr_rel_pos_r, z2y);
    AddRevoluteJoint(m_diff_links[0]->GetBody(), m_diff_bar->GetBody(), m_chassis,
                     tr_rel_pos_l + ChVector<>(tr_rel_pos_t.x() - tr_rel_pos_l.x(), 0, 0), QUNIT);
    AddRevoluteJoint(m_diff_links[1]->GetBody(), m_diff_bar->GetBody(), m_chassis,
                     tr_rel_pos_r + ChVector<>(tr_rel_pos_t.x() - tr_rel_pos_r.x(), 0, 0), QUNIT);

    // Add revolute joint for suspension rockers and bogies
    m_rocker_joints[0] = AddRevoluteJoint(m_rockers[0]->GetBody(), m_chassis->GetBody(), m_chassis, cr_rel_pos_lf, z2y);
    m_rocker_joints[1] = AddRevoluteJoint(m_rockers[1]->GetBody(), m_chassis->GetBody(), m_chassis, cr_rel_pos_rf, z2y);
    m_bogie_joints[0] =
        AddRevoluteJoint(m_bogies[0]->GetBody(), m_rockers[0]->GetBody(), m_chassis, cr_rel_pos_lb, z2y);
    m_bogie_joints[1] =
        AddRevoluteJoint(m_bogies[1]->GetBody(), m_rockers[1]->GetBody(), m_chassis, cr_rel_pos_rb, z2y);

    // Set initialization flag
    m_initialized = true;
}